

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::eliminate_noop(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  int *piVar3;
  Layer *pLVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar9 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar14 = 0;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar14]->type);
      if (iVar7 == 0) {
        pLVar2 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
        piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar3 == *(pointer *)
                       ((long)&(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8)) {
          eliminate_noop();
LAB_00137ecc:
          std::__cxx11::string::_M_replace
                    ((ulong)&pLVar2->type,0,(char *)(pLVar2->type)._M_string_length,0x5b119a);
        }
        else {
          uVar13 = (int)lVar14 - 1;
          if (-1 < (int)uVar13) {
            iVar7 = *piVar3;
            bVar15 = (int)lVar14 == 0;
            do {
              iVar8 = std::__cxx11::string::compare
                                ((char *)&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar13]->type);
              if (iVar8 != 0) {
                pLVar4 = (((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar13];
                lVar5 = *(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data;
                lVar10 = (long)*(pointer *)
                                ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl + 8) - lVar5;
                if (lVar10 != 0) {
                  lVar10 = lVar10 >> 2;
                  lVar12 = 0;
                  lVar11 = 0;
                  do {
                    if (*(int *)(lVar5 + lVar11 * 4) == iVar7) {
                      if (bVar15 || (int)lVar11 == -1) goto LAB_00137e45;
                      pLVar4 = (((this->super_ModelWriter).layers)->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start[(int)uVar13];
                      fprintf(_stderr,"eliminate_noop %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                              (pLVar2->name)._M_dataplus._M_p);
                      iVar7 = *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      *(int *)(*(long *)&(pLVar4->tops).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + (lVar12 >> 0x1e)) = iVar7;
                      (((this->super_ModelWriter).blobs)->
                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                      super__Vector_impl_data._M_start[iVar7].producer = uVar13;
                      goto LAB_00137ecc;
                    }
                    lVar11 = lVar11 + 1;
                    lVar12 = lVar12 + 0x100000000;
                  } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
                }
              }
              bVar15 = false;
              bVar6 = 0 < (int)uVar13;
              uVar13 = uVar13 - 1;
            } while (bVar6);
          }
        }
      }
LAB_00137e45:
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar9 + (ulong)(lVar9 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_noop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Noop")
            continue;

        ncnn::Layer* noop = layers[i];

        if (noop->bottoms.empty())
        {
            // Noop
            fprintf(stderr, "eliminate_noop %s\n", noop->name.c_str());

            size_t top_blob_count = noop->tops.size();
            for (size_t j = 0; j < top_blob_count; j++)
            {
                int top_blob_index_final = noop->tops[j];
                blobs[top_blob_index_final].producer = -1;
            }
            noop->type = "ncnnfused";

            continue;
        }

        // Any - Noop
        int bottom_blob_index = noop->bottoms[0];

        int j = i - 1;
        int any_k = -1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool link_noop = false;
            size_t top_blob_count = layers[j]->tops.size();
            for (size_t k = 0; k < top_blob_count; k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    link_noop = true;
                    any_k = k;
                    break;
                }
            }

            if (link_noop)
                break;
        }

        if (j == -1 || any_k == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_noop %s %s\n", any->name.c_str(), noop->name.c_str());

        int top_blob_index_final = noop->tops[0];
        any->tops[any_k] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;

        noop->type = "ncnnfused";
    }

    return 0;
}